

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O3

double __thiscall soinn::ESOINN::getSimilarityThreshold(ESOINN *this,Vertex *vertex)

{
  long *plVar1;
  StoredVertex *sv;
  StoredVertex *sv_1;
  long *plVar2;
  _List_node_base *p_Var3;
  StoredVertexList *pSVar4;
  double dVar5;
  double dVar6;
  _List_node_base *local_30;
  _List_node_base *local_28;
  
  plVar1 = (long *)*vertex;
  if (plVar1[2] == 0) {
    p_Var3 = (this->graph).super_type.m_vertices.super__List_base<void_*,_std::allocator<void_*>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    pSVar4 = &(this->graph).super_type.m_vertices;
    dVar5 = 1.79769313486232e+308;
    if (p_Var3 != (_List_node_base *)pSVar4) {
      dVar6 = dVar5;
      do {
        dVar5 = dVar6;
        if (p_Var3[1]._M_next != (_List_node_base *)*vertex) {
          local_30 = (_List_node_base *)*vertex + 2;
          local_28 = p_Var3[1]._M_next + 2;
          dVar5 = boost::numeric::ublas::
                  vector_norm_2<boost::numeric::ublas::vector_binary<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_minus<double,double>>>
                  ::
                  apply<boost::numeric::ublas::vector_binary<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_minus<double,double>>>
                            ((vector_expression<boost::numeric::ublas::vector_binary<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>_>
                              *)&local_30);
          if (dVar6 <= dVar5) {
            dVar5 = dVar6;
          }
        }
        p_Var3 = p_Var3->_M_next;
        dVar6 = dVar5;
      } while (p_Var3 != (_List_node_base *)pSVar4);
    }
  }
  else {
    plVar2 = (long *)*plVar1;
    if (plVar2 == plVar1) {
      dVar5 = 2.2250738585072014e-308;
    }
    else {
      dVar6 = 2.2250738585072014e-308;
      do {
        local_30 = (_List_node_base *)((long)*vertex + 0x20);
        local_28 = (_List_node_base *)(plVar2[2] + 0x20);
        dVar5 = boost::numeric::ublas::
                vector_norm_2<boost::numeric::ublas::vector_binary<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_minus<double,double>>>
                ::
                apply<boost::numeric::ublas::vector_binary<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_minus<double,double>>>
                          ((vector_expression<boost::numeric::ublas::vector_binary<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>_>
                            *)&local_30);
        if (dVar5 <= dVar6) {
          dVar5 = dVar6;
        }
        plVar2 = (long *)*plVar2;
        dVar6 = dVar5;
      } while (plVar2 != plVar1);
    }
  }
  return dVar5;
}

Assistant:

double ESOINN::getSimilarityThreshold(const Vertex& vertex)
{
    double dist = 0.0;
    if(!boost::out_degree(vertex, graph))
    {
        dist = std::numeric_limits<double>::max();
        VertexIterator current, end;
        boost::tie(current, end) = boost::vertices(graph);
        for(; current != end; current++)
        {
            if(*current != vertex)
            {
                double distCurrent = distance(graph[vertex].weight, graph[*current].weight);
                if(distCurrent < dist)
                {
                    dist = distCurrent;
                }
            }
        }
    }
    else
    {
        dist = std::numeric_limits<double>::min();
        AdjacencyIterator current, end;
        boost::tie(current, end) = boost::adjacent_vertices(vertex, graph);
        for(; current != end; current++)
        {
            double distCurrent = distance(graph[vertex].weight, graph[*current].weight);
            if(distCurrent > dist)
            {
                dist = distCurrent;
            }
        }
    }
    return dist;
}